

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O0

void test_2d_dynamic<30ul,1ul>(void)

{
  int iVar1;
  int iVar2;
  tuple<int,_int> *ptVar3;
  value_type vVar4;
  value_type vVar5;
  ulong uVar6;
  long lVar7;
  size_type sVar8;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var9;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var10;
  reference pvVar11;
  tuple<int,_int> *local_e0;
  tuple<int,_int> *local_d8;
  size_type local_d0;
  unsigned_long local_c8;
  value_type true_idx;
  int i;
  int j;
  tuple<int,_int> *dptr;
  allocator<std::tuple<int,_int>_> local_99;
  undefined1 local_98 [8];
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> data;
  size_type local_78;
  unsigned_long local_70;
  size_type local_68;
  unsigned_long local_60;
  size_type local_58;
  int local_4c;
  size_type local_48;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  unsigned_long local_38 [2];
  undefined1 local_28 [8];
  layout_mapping_left<dimensions<dyn,_dyn>,_dimensions<1,_1>,_dimensions<0,_0>_> l;
  
  local_38[1] = 0x1e;
  local_38[0] = 1;
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
  ::layout_mapping_regular_precomputed_strides<unsigned_long,unsigned_long>
            ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              *)local_28,local_38 + 1,local_38);
  local_39 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_regular();
  local_3a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x85,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_39,&local_3a);
  local_3b = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_dynamic_stride(0);
  local_3c = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x87,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_3b,&local_3c);
  local_3d = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_dynamic_stride(1);
  local_3e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x88,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_3d,&local_3e);
  local_48 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                       *)local_28,0);
  local_4c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x8a,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_48,&local_4c);
  local_58 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                       *)local_28,1);
  local_60 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x8b,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_58,&local_60);
  local_68 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_28);
  local_70 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x8d,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_68,&local_70);
  local_78 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::span((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)local_28);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x8e,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_78,
             (unsigned_long *)
             &data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_28,0);
  vVar5 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_28,1);
  std::allocator<std::tuple<int,_int>_>::allocator(&local_99);
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::vector
            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)local_98,
             vVar4 * vVar5,&local_99);
  std::allocator<std::tuple<int,_int>_>::~allocator(&local_99);
  _i = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::data
                 ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)local_98);
  true_idx._4_4_ = 0;
  while( true ) {
    uVar6 = (ulong)true_idx._4_4_;
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_28,1
                           );
    if (vVar4 <= uVar6) break;
    true_idx._0_4_ = 0;
    while( true ) {
      uVar6 = (ulong)(int)true_idx;
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_28
                              ,0);
      if (vVar4 <= uVar6) break;
      lVar7 = (long)(int)true_idx;
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_28
                              ,0);
      local_c8 = lVar7 + vVar4 * (long)true_idx._4_4_;
      local_d0 = std::experimental::
                 layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                 ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                   *)local_28,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x99,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_d0,&local_c8);
      ptVar3 = _i;
      sVar8 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_28,(int)true_idx,true_idx._4_4_);
      local_d8 = ptVar3 + sVar8;
      local_e0 = _i + local_c8;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x9b,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",&local_d8,&local_e0);
      ptVar3 = _i;
      iVar1 = (int)true_idx;
      sVar8 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_28,(int)true_idx,true_idx._4_4_);
      p_Var9 = std::get<0ul,int,int>(ptVar3 + sVar8);
      ptVar3 = _i;
      iVar2 = true_idx._4_4_;
      *p_Var9 = iVar1;
      sVar8 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_28,(int)true_idx,true_idx._4_4_);
      p_Var10 = std::get<1ul,int,int>(ptVar3 + sVar8);
      ptVar3 = _i;
      *p_Var10 = iVar2;
      sVar8 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_28,(int)true_idx,true_idx._4_4_);
      p_Var9 = std::get<0ul,int,int>(ptVar3 + sVar8);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xa0,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",p_Var9,(int *)&true_idx);
      ptVar3 = _i;
      sVar8 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_28,(int)true_idx,true_idx._4_4_);
      p_Var10 = std::get<1ul,int,int>(ptVar3 + sVar8);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xa1,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",p_Var10,
                 (int *)((long)&true_idx + 4));
      sVar8 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_28,(int)true_idx,true_idx._4_4_);
      pvVar11 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::at
                          ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)
                           local_98,sVar8);
      p_Var9 = std::get<0ul,int,int>(pvVar11);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(data.at(l.index(i, j))))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xa4,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",p_Var9,(int *)&true_idx);
      sVar8 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_28,(int)true_idx,true_idx._4_4_);
      pvVar11 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::at
                          ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)
                           local_98,sVar8);
      p_Var10 = std::get<1ul,int,int>(pvVar11);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(data.at(l.index(i, j))))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0xa5,"void test_2d_dynamic() [X = 30UL, Y = 1UL]",p_Var10,
                 (int *)((long)&true_idx + 4));
      true_idx._0_4_ = (int)true_idx + 1;
    }
    true_idx._4_4_ = true_idx._4_4_ + 1;
  }
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::~vector
            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)local_98);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<0, 0>
    > const l(X, Y);

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    vector<tuple<int, int> > data(l[0] * l[1]);
    tuple<int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j)))), j); 
    }
}